

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateSSEImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateSSEImpl<double,_2,_0>::accumulateDerivativesDispatch1<false>
          (BeagleCPU4StateSSEImpl<double,_2,_0> *this,double *outDerivatives,
          double *outSumDerivatives,double *outSumSquaredDerivatives)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar11;
  undefined1 auVar10 [16];
  double dVar12;
  double dVar14;
  undefined1 auVar13 [16];
  double dVar15;
  double dVar18;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  
  if (outSumDerivatives == (double *)0x0) {
    BeagleCPU4StateSSEImpl<double,2,0>::accumulateDerivativesDispatch2<false,false>
              ((BeagleCPU4StateSSEImpl<double,2,0> *)this,outDerivatives,(double *)0x0,
               outSumSquaredDerivatives);
    return;
  }
  if (outSumSquaredDerivatives != (double *)0x0) {
    lVar7 = (long)(this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>.
                  kPatternCount;
    pdVar2 = (this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>.
             grandNumeratorDerivTmp;
    pdVar3 = (this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>.
             gPatternWeights;
    pdVar4 = (this->super_BeagleCPU4StateImpl<double,_2,_0>).super_BeagleCPUImpl<double,_2,_0>.
             grandDenominatorDerivTmp;
    dVar9 = 0.0;
    dVar11 = 0.0;
    dVar12 = 0.0;
    dVar14 = 0.0;
    for (lVar8 = 0; lVar8 < lVar7 + -1; lVar8 = lVar8 + 2) {
      pdVar1 = pdVar3 + lVar8;
      dVar5 = *pdVar1;
      dVar6 = pdVar1[1];
      auVar13 = vdivpd_avx(*(undefined1 (*) [16])(pdVar2 + lVar8),
                           *(undefined1 (*) [16])(pdVar4 + lVar8));
      dVar15 = auVar13._0_8_;
      dVar18 = auVar13._8_8_;
      dVar12 = dVar12 + dVar15 * dVar5;
      dVar14 = dVar14 + dVar18 * dVar6;
      dVar9 = dVar9 + dVar15 * dVar15 * dVar5;
      dVar11 = dVar11 + dVar18 * dVar18 * dVar6;
    }
    auVar13._0_8_ = dVar12 + dVar14;
    auVar13._8_8_ = dVar12 + dVar14;
    auVar10._0_8_ = dVar9 + dVar11;
    auVar10._8_8_ = dVar9 + dVar11;
    while (lVar8 < lVar7) {
      auVar19._8_8_ = 0;
      auVar19._0_8_ = pdVar3[lVar8];
      auVar16._0_8_ = pdVar2[lVar8] / pdVar4[lVar8];
      auVar16._8_8_ = 0;
      lVar8 = lVar8 + 1;
      auVar13 = vfmadd231sd_fma(auVar13,auVar16,auVar19);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = auVar16._0_8_ * auVar16._0_8_;
      auVar10 = vfmadd231sd_fma(auVar10,auVar19,auVar17);
    }
    *outSumDerivatives = auVar13._0_8_;
    *outSumSquaredDerivatives = auVar10._0_8_;
    return;
  }
  BeagleCPU4StateSSEImpl<double,2,0>::accumulateDerivativesImpl<false,true,false>
            ((BeagleCPU4StateSSEImpl<double,2,0> *)this,outDerivatives,outSumDerivatives,
             (double *)0x0);
  return;
}

Assistant:

BEAGLE_CPU_4_SSE_TEMPLATE template <bool DoDerivatives>
void BeagleCPU4StateSSEImpl<BEAGLE_CPU_4_SSE_DOUBLE>::accumulateDerivativesDispatch1(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    if (outSumDerivatives == NULL) {
        accumulateDerivativesDispatch2<DoDerivatives, false>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    } else {
        accumulateDerivativesDispatch2<DoDerivatives, true>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    }
}